

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::FileDescriptorSet::IsInitialized(FileDescriptorSet *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  
  lVar1 = (long)(this->file_).super_RepeatedPtrFieldBase.current_size_;
  do {
    lVar3 = lVar1;
    if (lVar3 < 1) break;
    bVar2 = FileDescriptorProto::IsInitialized
                      ((FileDescriptorProto *)
                       ((this->file_).super_RepeatedPtrFieldBase.rep_)->elements[lVar3 + -1]);
    lVar1 = lVar3 + -1;
  } while (bVar2);
  return lVar3 < 1;
}

Assistant:

bool FileDescriptorSet::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->file())) return false;
  return true;
}